

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O2

void secp256k1_scalar_cmov(secp256k1_scalar *r,secp256k1_scalar *a,int flag)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = (ulong)(uint)flag - 1;
  uVar2 = -(ulong)(uint)flag;
  r->d[0] = a->d[0] & uVar2 | r->d[0] & uVar1;
  r->d[1] = a->d[1] & uVar2 | r->d[1] & uVar1;
  r->d[2] = a->d[2] & uVar2 | r->d[2] & uVar1;
  r->d[3] = uVar2 & a->d[3] | uVar1 & r->d[3];
  return;
}

Assistant:

static SECP256K1_INLINE void secp256k1_scalar_cmov(secp256k1_scalar *r, const secp256k1_scalar *a, int flag) {
    uint64_t mask0, mask1;
    VG_CHECK_VERIFY(r->d, sizeof(r->d));
    mask0 = flag + ~((uint64_t)0);
    mask1 = ~mask0;
    r->d[0] = (r->d[0] & mask0) | (a->d[0] & mask1);
    r->d[1] = (r->d[1] & mask0) | (a->d[1] & mask1);
    r->d[2] = (r->d[2] & mask0) | (a->d[2] & mask1);
    r->d[3] = (r->d[3] & mask0) | (a->d[3] & mask1);
}